

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

ostream * argparse::operator<<(ostream *stream,Argument *argument)

{
  ostream *poVar1;
  long in_RSI;
  ostream *in_RDI;
  stringstream nameStream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffde8;
  string local_1f8 [32];
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  *in_stack_fffffffffffffe28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe30;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  in_stack_fffffffffffffe38;
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  stringstream local_198 [16];
  ostream_type local_188 [376];
  long local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (in_stack_fffffffffffffde8);
  local_1a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        (in_stack_fffffffffffffde8);
  std::
  ostream_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_std::char_traits<char>_>
  ::ostream_iterator(&local_1b8,local_188," ");
  std::
  copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::ostream_iterator<std::__cxx11::string,char,std::char_traits<char>>>
            (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  poVar1 = local_8;
  std::__cxx11::stringstream::str();
  poVar1 = std::operator<<(poVar1,local_1f8);
  poVar1 = std::operator<<(poVar1,"\t");
  std::operator<<(poVar1,(string *)(local_10 + 0x28));
  std::__cxx11::string::~string(local_1f8);
  if ((*(byte *)(local_10 + 0xac) >> 1 & 1) != 0) {
    std::operator<<(local_8,"[Required]");
  }
  std::operator<<(local_8,"\n");
  std::__cxx11::stringstream::~stringstream(local_198);
  return local_8;
}

Assistant:

std::ostream &operator<<(std::ostream &stream,
                                  const Argument &argument) {
    std::stringstream nameStream;
    std::copy(std::begin(argument.mNames), std::end(argument.mNames),
              std::ostream_iterator<std::string>(nameStream, " "));
    stream << nameStream.str() << "\t" << argument.mHelp;
    if (argument.mIsRequired)
      stream << "[Required]";
    stream << "\n";
    return stream;
  }